

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# render.cpp
# Opt level: O2

void nivalis::anon_unknown_1::buf_add_screen_polyline
               (vector<nivalis::DrawBufferObject,_std::allocator<nivalis::DrawBufferObject>_>
                *draw_buf,View *render_view,
               vector<std::array<float,_2UL>,_std::allocator<std::array<float,_2UL>_>_>
               *points_screen,color *c,size_t rel_func,float thickness,bool closed,bool line,
               bool filled)

{
  int iVar1;
  int iVar2;
  pointer paVar3;
  pointer paVar4;
  double *pdVar5;
  long lVar6;
  undefined1 in_stack_ffffffffffffffb0;
  vector<std::array<double,_2UL>,_std::allocator<std::array<double,_2UL>_>_> points_conv;
  
  points_conv.super__Vector_base<std::array<double,_2UL>,_std::allocator<std::array<double,_2UL>_>_>
  ._M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
  points_conv.super__Vector_base<std::array<double,_2UL>,_std::allocator<std::array<double,_2UL>_>_>
  ._M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
  points_conv.super__Vector_base<std::array<double,_2UL>,_std::allocator<std::array<double,_2UL>_>_>
  ._M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  std::vector<std::array<double,_2UL>,_std::allocator<std::array<double,_2UL>_>_>::resize
            (&points_conv,
             (long)(points_screen->
                   super__Vector_base<std::array<float,_2UL>,_std::allocator<std::array<float,_2UL>_>_>
                   )._M_impl.super__Vector_impl_data._M_finish -
             (long)(points_screen->
                   super__Vector_base<std::array<float,_2UL>,_std::allocator<std::array<float,_2UL>_>_>
                   )._M_impl.super__Vector_impl_data._M_start >> 3);
  paVar3 = (points_screen->
           super__Vector_base<std::array<float,_2UL>,_std::allocator<std::array<float,_2UL>_>_>).
           _M_impl.super__Vector_impl_data._M_start;
  paVar4 = (points_screen->
           super__Vector_base<std::array<float,_2UL>,_std::allocator<std::array<float,_2UL>_>_>).
           _M_impl.super__Vector_impl_data._M_finish;
  iVar1 = render_view->swid;
  iVar2 = render_view->shigh;
  pdVar5 = (points_conv.
            super__Vector_base<std::array<double,_2UL>,_std::allocator<std::array<double,_2UL>_>_>.
            _M_impl.super__Vector_impl_data._M_start)->_M_elems + 1;
  for (lVar6 = 0; (long)paVar4 - (long)paVar3 >> 3 != lVar6; lVar6 = lVar6 + 1) {
    ((array<double,_2UL> *)(pdVar5 + -1))->_M_elems[0] =
         (render_view->xmax - render_view->xmin) *
         ((double)paVar3[lVar6]._M_elems[0] / (double)iVar1) + render_view->xmin;
    *pdVar5 = (render_view->ymax - render_view->ymin) *
              ((double)((float)iVar2 - paVar3[lVar6]._M_elems[1]) / (double)iVar2) +
              render_view->ymin;
    pdVar5 = pdVar5 + 2;
  }
  buf_add_polyline(draw_buf,(View *)&points_conv,
                   (vector<std::array<double,_2UL>,_std::allocator<std::array<double,_2UL>_>_> *)c,
                   (color *)rel_func,0,SUB84((double)iVar1,0),true,false,
                   (bool)in_stack_ffffffffffffffb0);
  std::_Vector_base<std::array<double,_2UL>,_std::allocator<std::array<double,_2UL>_>_>::
  ~_Vector_base(&points_conv.
                 super__Vector_base<std::array<double,_2UL>,_std::allocator<std::array<double,_2UL>_>_>
               );
  return;
}

Assistant:

void buf_add_screen_polyline(
        std::vector<DrawBufferObject>& draw_buf,
        const Plotter::View& render_view,
        const std::vector<std::array<float, 2> >& points_screen,
        const color::color& c, size_t rel_func, float thickness = 1.,
        bool closed = false, bool line = true, bool filled = false) {
    std::vector<std::array<double, 2> > points_conv;
    points_conv.resize(points_screen.size());
    for (size_t i = 0; i < points_screen.size(); ++i) {
        points_conv[i][0] = points_screen[i][0]*1. / render_view.swid *
            (render_view.xmax - render_view.xmin) + render_view.xmin;
        points_conv[i][1] = (render_view.shigh - points_screen[i][1])*1. /
            render_view.shigh * (render_view.ymax - render_view.ymin) + render_view.ymin;
    }
    buf_add_polyline(draw_buf, render_view, points_conv, c, rel_func,
            thickness, closed, line, filled) ;
}